

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O2

bool wasm::canChangeState(string *name,Split *stateChangers)

{
  pointer pbVar1;
  bool bVar2;
  iterator __begin1;
  pointer pattern;
  bool bVar3;
  
  pattern = (stateChangers->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (stateChangers->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pattern == pbVar1) {
    bVar3 = true;
  }
  else {
    do {
      bVar3 = pattern != pbVar1;
      if (pattern == pbVar1) {
        return bVar3;
      }
      bVar2 = String::wildcardMatch(pattern,name);
      pattern = pattern + 1;
    } while (!bVar2);
  }
  return bVar3;
}

Assistant:

static bool canChangeState(std::string name, String::Split stateChangers) {
  // When no state changers are given default to everything changes state.
  if (stateChangers.empty()) {
    return true;
  }
  for (auto& stateChanger : stateChangers) {
    if (String::wildcardMatch(stateChanger, name)) {
      return true;
    }
  }
  return false;
}